

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::ParsedScene::Attribute
          (ParsedScene *this,string *target,ParsedParameterVector attrib,FileLoc loc)

{
  long lVar1;
  GraphicsState *pGVar2;
  bool bVar3;
  long in_RDX;
  long lVar4;
  long lVar5;
  long lVar6;
  ParsedParameter *p;
  ParsedParameter *local_38;
  
  if (this->currentApiState == Uninitialized) {
    Error<char_const(&)[10]>
              ((FileLoc *)&attrib,"pbrtInit() must be before calling \"%s()\". Ignoring.",
               (char (*) [10])0x3035a18);
  }
  else {
    bVar3 = std::operator==(target,"shape");
    lVar5 = 0x118;
    if (!bVar3) {
      bVar3 = std::operator==(target,"light");
      lVar5 = 0x178;
      if (!bVar3) {
        bVar3 = std::operator==(target,"material");
        lVar5 = 0x1d8;
        if (!bVar3) {
          bVar3 = std::operator==(target,"medium");
          lVar5 = 0x238;
          if (!bVar3) {
            bVar3 = std::operator==(target,"texture");
            lVar5 = 0x298;
            if (!bVar3) {
              (this->super_SceneRepresentation).errorExit = true;
              Error<std::__cxx11::string_const&>
                        ((FileLoc *)&attrib,
                         "Unknown attribute target \"%s\". Must be \"shape\", \"light\", \"material\", \"medium\", or \"texture\"."
                         ,target);
              return;
            }
          }
        }
      }
    }
    lVar1 = *(long *)(in_RDX + 0x58);
    pGVar2 = this->graphicsState;
    lVar6 = in_RDX + 0x10;
    if (*(long *)(in_RDX + 8) != 0) {
      lVar6 = *(long *)(in_RDX + 8);
    }
    for (lVar4 = 0; lVar1 << 3 != lVar4; lVar4 = lVar4 + 8) {
      local_38 = *(ParsedParameter **)(lVar6 + lVar4);
      local_38->mayBeUnused = true;
      local_38->colorSpace = this->graphicsState->colorSpace;
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::push_back((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                   *)((long)&(pGVar2->currentInsideMedium)._M_dataplus._M_p + lVar5),&local_38);
    }
  }
  return;
}

Assistant:

void ParsedScene::Attribute(const std::string &target, ParsedParameterVector attrib,
                            FileLoc loc) {
    VERIFY_INITIALIZED("Attribute");

    ParsedParameterVector *currentAttributes = nullptr;
    if (target == "shape") {
        currentAttributes = &graphicsState->shapeAttributes;
    } else if (target == "light") {
        currentAttributes = &graphicsState->lightAttributes;
    } else if (target == "material") {
        currentAttributes = &graphicsState->materialAttributes;
    } else if (target == "medium") {
        currentAttributes = &graphicsState->mediumAttributes;
    } else if (target == "texture") {
        currentAttributes = &graphicsState->textureAttributes;
    } else {
        ErrorExitDeferred(
            &loc,
            "Unknown attribute target \"%s\". Must be \"shape\", \"light\", "
            "\"material\", \"medium\", or \"texture\".",
            target);
        return;
    }

    // Note that we hold on to the current color space and associate it
    // with the parameters...
    for (ParsedParameter *p : attrib) {
        p->mayBeUnused = true;
        p->colorSpace = graphicsState->colorSpace;
        currentAttributes->push_back(p);
    }
}